

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KryoFlux.cpp
# Opt level: O0

int __thiscall KryoFlux::SelectDensity(KryoFlux *this,bool density)

{
  int iVar1;
  string local_38;
  undefined1 local_11;
  KryoFlux *pKStack_10;
  bool density_local;
  KryoFlux *this_local;
  
  local_11 = density;
  pKStack_10 = this;
  (**(code **)(*(long *)this + 0x18))(&local_38,this,8,density,0);
  iVar1 = ResponseCode(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return iVar1;
}

Assistant:

int KryoFlux::SelectDensity(bool density)
{
    return ResponseCode(Control(REQ_DENSITY, density));
}